

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
MADPComponentDiscreteObservations::JointToIndividualObservationIndices
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          MADPComponentDiscreteObservations *this,Index jo_e,Scope *agSC)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> nr_A_e;
  allocator_type local_41;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40,
             (long)(agSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(agSC->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 2,&local_41);
  IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
            (&this->_m_nrObservations,agSC,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40);
  IndexTools::JointToIndividualIndices
            (__return_storage_ptr__,jo_e,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> MADPComponentDiscreteObservations::
JointToIndividualObservationIndices(
        Index jo_e, const Scope& agSC) const
{
    vector<size_t> nr_A_e(agSC.size());
    IndexTools::RestrictIndividualIndicesToScope(
        GetNrObservations(), agSC, nr_A_e);
    vector<Index> jo_e_vec = IndexTools::JointToIndividualIndices(jo_e, nr_A_e);
    return(jo_e_vec);
}